

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

int msr_is_zone_clamped(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,int *cl_long,
                       int *cl_short)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  if (ctx == (raplcap_msr_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                  ,0x238,
                  "int msr_is_zone_clamped(const raplcap_msr_ctx *, raplcap_zone, uint64_t, int *, int *)"
                 );
  }
  lVar3 = 0x30;
  iVar1 = 0x10;
  if ((zone == RAPLCAP_ZONE_PSYS) && ((ctx->cpu_model | 0x40) == 0xcf)) {
    lVar3 = 0x32;
    iVar1 = 0x12;
  }
  if (cl_long != (int *)0x0) {
    *cl_long = (uint)(((uint)msrval >> iVar1 & 1) != 0);
  }
  uVar2 = (uint)(cl_long != (int *)0x0);
  if ((cl_short != (int *)0x0) && (1 < ctx->cfg[zone].constraints)) {
    *cl_short = (uint)((msrval >> lVar3 & 1) != 0);
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

int msr_is_zone_clamped(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                        int* cl_long, int* cl_short) {
  assert(ctx != NULL);
  int ret = 0;
  uint8_t cl1_shift = CL1_SHIFT;
  uint8_t cl2_shift = CL2_SHIFT;
  zone_clamped_quirks(ctx, zone, &cl1_shift, &cl2_shift);
  if (cl_long != NULL) {
    *cl_long = ((msrval >> cl1_shift) & CL_MASK) == 0x1;
    raplcap_log(DEBUG, "msr_is_zone_clamped: zone=%d, long_term: clamp=%d\n", zone, *cl_long);
    ret++;
  }
  if (cl_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    *cl_short = ((msrval >> cl2_shift) & CL_MASK) == 0x1;
    raplcap_log(DEBUG, "msr_is_zone_clamped: zone=%d, short_term: clamp=%d\n", zone, *cl_short);
    ret++;
  }
  return ret;
}